

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O3

void av1_setup_frame_sign_bias(AV1_COMMON *cm)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  
  lVar1 = 0;
  do {
    uVar2 = 0;
    if ((((long)cm->remapped_ref_idx[lVar1] != -1) &&
        ((cm->seq_params->order_hint_info).enable_order_hint != 0)) &&
       (cm->ref_frame_map[cm->remapped_ref_idx[lVar1]] != (RefCntBuffer *)0x0)) {
      uVar2 = 1 << ((byte)(cm->seq_params->order_hint_info).order_hint_bits_minus_1 & 0x1f);
      uVar3 = cm->ref_frame_map[cm->remapped_ref_idx[lVar1]]->order_hint -
              (cm->current_frame).order_hint;
      uVar2 = (uint)((int)(uVar2 & uVar3) < (int)(uVar2 - 1 & uVar3));
    }
    cm->ref_frame_sign_bias[lVar1 + 1] = uVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 7);
  return;
}

Assistant:

void av1_setup_frame_sign_bias(AV1_COMMON *cm) {
  MV_REFERENCE_FRAME ref_frame;
  for (ref_frame = LAST_FRAME; ref_frame <= ALTREF_FRAME; ++ref_frame) {
    const RefCntBuffer *const buf = get_ref_frame_buf(cm, ref_frame);
    if (cm->seq_params->order_hint_info.enable_order_hint && buf != NULL) {
      const int ref_order_hint = buf->order_hint;
      cm->ref_frame_sign_bias[ref_frame] =
          (get_relative_dist(&cm->seq_params->order_hint_info, ref_order_hint,
                             (int)cm->current_frame.order_hint) <= 0)
              ? 0
              : 1;
    } else {
      cm->ref_frame_sign_bias[ref_frame] = 0;
    }
  }
}